

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriterGeneric.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::ssc::SscWriterGeneric::Close(SscWriterGeneric *this,int transportIndex)

{
  undefined8 uVar1;
  bool bVar2;
  undefined4 uVar3;
  size_type sVar4;
  ompi_request_t **ppoVar5;
  uint8_t *puVar6;
  reference ppVar7;
  reference ppoVar8;
  long in_RDI;
  pair<const_int,_std::pair<unsigned_long,_unsigned_long>_> *i;
  iterator __end4;
  iterator __begin4;
  RankPosMap *__range4;
  vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_> requests;
  bool in_stack_000000df;
  SscWriterGeneric *in_stack_000000e0;
  unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  *in_stack_ffffffffffffff68;
  vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_> *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff84;
  _Node_iterator_base<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_false>
  local_40;
  _Node_iterator_base<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_false>
  local_38;
  long local_30;
  vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_> local_28;
  
  if (((*(byte *)(in_RDI + 0x80) & 1) != 0) &&
     (bVar2 = std::thread::joinable((thread *)in_stack_ffffffffffffff70), bVar2)) {
    std::thread::join();
  }
  if (((*(byte *)(in_RDI + 0x158) & 1) == 0) || ((*(byte *)(in_RDI + 0x159) & 1) == 0)) {
    MPI_Win_free(in_RDI + 200);
    SyncWritePattern(in_stack_000000e0,in_stack_000000df);
  }
  else {
    if (0 < *(long *)(in_RDI + 0x50)) {
      sVar4 = std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::size
                        ((vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_> *)
                         (in_RDI + 0x108));
      ppoVar5 = std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::data
                          ((vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_> *)0x1d1b8a);
      MPI_Waitall(sVar4 & 0xffffffff,ppoVar5,0);
      std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::clear
                ((vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_> *)0x1d1bab);
    }
    puVar6 = Buffer::operator[]((Buffer *)(in_RDI + 0x38),0);
    *puVar6 = '\x01';
    std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::vector
              ((vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_> *)0x1d1bca);
    local_30 = in_RDI + 0x120;
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
         ::begin(in_stack_ffffffffffffff68);
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
         ::end(in_stack_ffffffffffffff68);
    while (bVar2 = std::__detail::operator!=(&local_38,&local_40), bVar2) {
      ppVar7 = std::__detail::
               _Node_iterator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_false,_false>
               ::operator*((_Node_iterator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_false,_false>
                            *)0x1d1c1a);
      std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::emplace_back<>
                (in_stack_ffffffffffffff70);
      puVar6 = Buffer::data((Buffer *)(in_RDI + 0x38),0);
      in_stack_ffffffffffffff84 = ppVar7->first;
      uVar1 = *(undefined8 *)(in_RDI + 0x10);
      ppoVar8 = std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::back
                          (in_stack_ffffffffffffff70);
      MPI_Isend(puVar6,1,&ompi_mpi_char,in_stack_ffffffffffffff84,0,uVar1,ppoVar8);
      std::__detail::
      _Node_iterator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_false,_false>::
      operator++((_Node_iterator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_false,_false>
                  *)in_stack_ffffffffffffff70);
    }
    sVar4 = std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::size(&local_28);
    uVar3 = (undefined4)sVar4;
    ppoVar5 = std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::data
                        ((vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_> *)0x1d1cdc);
    MPI_Waitall(uVar3,ppoVar5,0);
    std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::~vector
              ((vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_> *)
               CONCAT44(in_stack_ffffffffffffff84,uVar3));
  }
  return;
}

Assistant:

void SscWriterGeneric::Close(const int transportIndex)
{
    if (m_Threading && m_EndStepThread.joinable())
    {
        m_EndStepThread.join();
    }

    if (m_WriterDefinitionsLocked && m_ReaderSelectionsLocked)
    {
        if (m_CurrentStep > 0)
        {
            MPI_Waitall(static_cast<int>(m_MpiRequests.size()), m_MpiRequests.data(),
                        MPI_STATUSES_IGNORE);
            m_MpiRequests.clear();
        }

        m_Buffer[0] = 1;

        std::vector<MPI_Request> requests;
        for (const auto &i : m_AllSendingReaderRanks)
        {
            requests.emplace_back();
            MPI_Isend(m_Buffer.data(), 1, MPI_CHAR, i.first, 0, m_StreamComm, &requests.back());
        }
        MPI_Waitall(static_cast<int>(requests.size()), requests.data(), MPI_STATUS_IGNORE);
    }
    else
    {
        MPI_Win_free(&m_MpiWin);
        SyncWritePattern(true);
    }
}